

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFromObject
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  bool bVar1;
  long lVar2;
  Printer *this_00;
  FieldDescriptor *this_01;
  FieldDescriptor *field;
  long lVar3;
  string local_50;
  
  this_00 = printer;
  io::Printer::Print<>(printer,"if (jspb.Message.GENERATE_FROM_OBJECT) {\n\n");
  GenerateObjectTypedef((Generator *)this_00,options,printer,desc);
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
             (GeneratorOptions *)(options->namespace_prefix)._M_string_length,desc);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "/**\n * Loads data from an object into a new instance of this proto.\n * @param {!$classname$.ObjectFormat} obj\n *     The object representation of this proto to load the data from.\n * @return {!$classname$}\n */\n$classname$.fromObject = function(obj) {\n  var msg = new $classname$();\n"
             ,(char (*) [10])0x3a8a6c,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (0 < *(int *)(desc + 0x68)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      field = (FieldDescriptor *)(*(long *)(desc + 0x28) + lVar3);
      this_01 = field;
      bVar1 = anon_unknown_0::IgnoreField(field);
      if (!bVar1) {
        GenerateClassFieldFromObject((Generator *)this_01,options,printer,field);
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x98;
    } while (lVar2 < *(int *)(desc + 0x68));
  }
  io::Printer::Print<>(printer,"  return msg;\n};\n}\n\n");
  return;
}

Assistant:

void Generator::GenerateClassFromObject(const GeneratorOptions& options,
                                        io::Printer* printer,
                                        const Descriptor* desc) const {
  printer->Print("if (jspb.Message.GENERATE_FROM_OBJECT) {\n\n");

  GenerateObjectTypedef(options, printer, desc);

  printer->Print(
      "/**\n"
      " * Loads data from an object into a new instance of this proto.\n"
      " * @param {!$classname$.ObjectFormat} obj\n"
      " *     The object representation of this proto to load the data from.\n"
      " * @return {!$classname$}\n"
      " */\n"
      "$classname$.fromObject = function(obj) {\n"
      "  var msg = new $classname$();\n",
      "classname", GetMessagePath(options, desc));

  for (int i = 0; i < desc->field_count(); i++) {
    const FieldDescriptor* field = desc->field(i);
    if (!IgnoreField(field)) {
      GenerateClassFieldFromObject(options, printer, field);
    }
  }

  printer->Print(
      "  return msg;\n"
      "};\n"
      "}\n\n");
}